

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

void max_cb(Fl_Value_Input *i,void *v)

{
  double dVar1;
  Fl_Type *this;
  bool bVar2;
  int iVar3;
  long lVar4;
  Fl_Widget_Type *q;
  Fl_Type *pFVar5;
  Fl_Image *v_00;
  
  if ((char *)v == "LOAD") {
    iVar3 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1c])();
    if (iVar3 == 0) {
      iVar3 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1d])();
      if (iVar3 == 0) {
        Fl_Widget::deactivate((Fl_Widget *)i);
        return;
      }
      Fl_Widget::activate((Fl_Widget *)i);
      v_00 = current_widget->o[1].label_.image;
    }
    else {
      Fl_Widget::activate((Fl_Widget *)i);
      v_00 = (Fl_Image *)current_widget->o[1].user_data_;
    }
    Fl_Valuator::value(&i->super_Fl_Valuator,(double)v_00);
    return;
  }
  if (Fl_Type::first != (Fl_Type *)0x0) {
    dVar1 = (i->super_Fl_Valuator).value_;
    bVar2 = false;
    pFVar5 = Fl_Type::first;
    do {
      if (pFVar5->selected != '\0') {
        iVar3 = (*pFVar5->_vptr_Fl_Type[0x17])(pFVar5);
        if (iVar3 != 0) {
          iVar3 = (*pFVar5->_vptr_Fl_Type[0x1c])(pFVar5);
          lVar4 = 0x90;
          if (iVar3 == 0) {
            iVar3 = (*pFVar5->_vptr_Fl_Type[0x1d])(pFVar5);
            lVar4 = 0xb0;
            if (iVar3 == 0) goto LAB_00186567;
          }
          this = pFVar5[1].prev;
          *(double *)((long)&this->_vptr_Fl_Type + lVar4) = dVar1;
          Fl_Widget::redraw((Fl_Widget *)this);
          bVar2 = true;
        }
      }
LAB_00186567:
      pFVar5 = pFVar5->next;
    } while (pFVar5 != (Fl_Type *)0x0);
    if (bVar2) {
      set_modflag(1);
      return;
    }
  }
  return;
}

Assistant:

void max_cb(Fl_Value_Input* i, void* v) {
  if (v == LOAD) {
    if (current_widget->is_valuator()) {
      i->activate();
      i->value(((Fl_Valuator*)(current_widget->o))->maximum());
    } else if (current_widget->is_spinner()) {
      i->activate();
      i->value(((Fl_Spinner*)(current_widget->o))->maximum());
    } else {
      i->deactivate();
      return;
    }
  } else {
    int mod = 0;
    double n = i->value();
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	if (q->is_valuator()) {
	  ((Fl_Valuator*)(q->o))->maximum(n);
	  q->o->redraw();
	  mod = 1;
        } else if (q->is_spinner()) {
          ((Fl_Spinner*)(q->o))->maximum(n);
          q->o->redraw();
          mod = 1;
	}
      }
    }
    if (mod) set_modflag(1);
  }
}